

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetDevice_Ex
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,
          IOTHUB_DEVICE_EX *deviceInfo)

{
  LOGGER_LOG p_Var1;
  undefined1 local_d8 [8];
  IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_DEVICE_EX *deviceInfo_local;
  char *deviceId_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if (((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) || (deviceId == (char *)0x0))
     || (deviceInfo == (IOTHUB_DEVICE_EX *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetDevice_Ex",0x65b,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if ((deviceInfo->version < 1) || (1 < deviceInfo->version)) {
    deviceOrModuleInfo.managedBy = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)deviceOrModuleInfo.managedBy != (LOGGER_LOG)0x0) {
      (*(code *)deviceOrModuleInfo.managedBy)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                 ,"IoTHubRegistryManager_GetDevice_Ex",0x661,1,
                 "deviceInfo must have a valid version");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
  }
  else {
    memset(local_d8,0,0xa0);
    l._4_4_ = IoTHubRegistryManager_GetDeviceOrModule
                        (registryManagerHandle,deviceId,(char *)0x0,
                         (IOTHUB_DEVICE_OR_MODULE *)local_d8);
    if (l._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
      move_deviceOrModule_members_to_deviceEx((IOTHUB_DEVICE_OR_MODULE *)local_d8,deviceInfo);
      free_nonDeviceEx_members_from_deviceOrModule((IOTHUB_DEVICE_OR_MODULE *)local_d8);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetDevice_Ex(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, IOTHUB_DEVICE_EX* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((deviceInfo->version < IOTHUB_DEVICE_EX_VERSION_1) ||
            (deviceInfo->version > IOTHUB_DEVICE_EX_VERSION_LATEST))
    {
        LogError("deviceInfo must have a valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, NULL, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_deviceEx(&deviceOrModuleInfo, deviceInfo);
            free_nonDeviceEx_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}